

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_additive(t_parser *this,bool a_assignable)

{
  bool bVar1;
  bool bVar2;
  t_script *ptVar3;
  pointer *__ptr;
  undefined7 in_register_00000031;
  long lVar4;
  wchar_t wVar5;
  t_at at;
  t_script *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  lVar4 = CONCAT71(in_register_00000031,a_assignable);
  f_multiplicative(this,a_assignable);
  bVar2 = false;
  do {
    if (*(char *)(lVar4 + 0x68) != '\0') {
      return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )this;
    }
    if (*(int *)(lVar4 + 0x88) == 8) {
      wVar5 = L'\x9e';
LAB_0016b03b:
      local_38 = *(size_type *)(lVar4 + 0x60);
      _local_48 = *(pointer *)(lVar4 + 0x50);
      _uStack_40 = *(size_type *)(lVar4 + 0x58);
      t_lexer::f_next((t_lexer *)(lVar4 + 8));
      ptVar3 = (t_script *)operator_new(0x38);
      f_multiplicative((t_parser *)&stack0xffffffffffffffb0,a_assignable);
      (ptVar3->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_node_0019ac90;
      *(undefined4 *)&(ptVar3->v_path)._M_dataplus._M_p = local_48;
      *(undefined4 *)((long)&(ptVar3->v_path)._M_dataplus._M_p + 4) = uStack_44;
      *(undefined4 *)&(ptVar3->v_path)._M_string_length = uStack_40;
      *(undefined4 *)((long)&(ptVar3->v_path)._M_string_length + 4) = uStack_3c;
      (ptVar3->v_path).field_2._M_allocated_capacity = local_38;
      (ptVar3->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_binary_0019b250;
      (ptVar3->v_path).field_2._M_local_buf[2] = wVar5;
      (ptVar3->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)this->v_module;
      this->v_module = (t_script *)0x0;
      (ptVar3->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map_size = (size_t)local_50;
      local_50 = (t_script *)0x0;
      this->v_module = ptVar3;
      bVar1 = true;
    }
    else {
      if (*(int *)(lVar4 + 0x88) == 10) {
        wVar5 = L'·';
        goto LAB_0016b03b;
      }
      bVar2 = true;
      bVar1 = false;
    }
    if (!bVar1) {
      if (!bVar2) {
        if (this->v_module != (t_script *)0x0) {
          (*(this->v_module->super_t_body)._vptr_t_body[1])();
        }
        this->v_module = (t_script *)0x0;
      }
      return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
              )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
                )this;
    }
  } while( true );
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_additive(bool a_assignable)
{
	auto node = f_multiplicative(a_assignable);
	while (!v_lexer.f_newline()) {
		t_instruction instruction;
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__PLUS:
			instruction = c_instruction__ADD_TT;
			break;
		case t_lexer::c_token__HYPHEN:
			instruction = c_instruction__SUBTRACT_TT;
			break;
		default:
			return node;
		}
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		node.reset(new ast::t_binary(at, instruction, std::move(node), f_multiplicative(false)));
	}
	return node;
}